

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window.cxx
# Opt level: O0

void __thiscall Fl_Window::icons(Fl_Window *this,Fl_RGB_Image **icons,int count)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  EVP_PKEY_CTX *src;
  undefined4 extraout_var;
  EVP_PKEY_CTX *dst;
  int local_20;
  int i;
  int count_local;
  Fl_RGB_Image **icons_local;
  Fl_Window *this_local;
  
  dst = (EVP_PKEY_CTX *)icons;
  free_icons(this);
  if (0 < count) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)count;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    src = (EVP_PKEY_CTX *)operator_new__(uVar3);
    *(EVP_PKEY_CTX **)(this->icon_ + 8) = src;
    *(int *)(this->icon_ + 0x10) = count;
    for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
      iVar2 = Fl_RGB_Image::copy(icons[local_20],dst,src);
      src = (EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2);
      *(EVP_PKEY_CTX **)(*(long *)(this->icon_ + 8) + (long)local_20 * 8) = src;
    }
  }
  if (this->i != (Fl_X *)0x0) {
    Fl_X::set_icons(this->i);
  }
  return;
}

Assistant:

void Fl_Window::icons(const Fl_RGB_Image *icons[], int count) {
  free_icons();

  if (count > 0) {
    icon_->icons = new Fl_RGB_Image*[count];
    icon_->count = count;
    // FIXME: Fl_RGB_Image lacks const modifiers on methods
    for (int i = 0;i < count;i++)
      icon_->icons[i] = (Fl_RGB_Image*)((Fl_RGB_Image*)icons[i])->copy();
  }

  if (i)
    i->set_icons();
}